

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

void CServerBrowser::CBFTrackPacket(int TrackID,void *pCallbackUser)

{
  int64 iVar1;
  long in_RSI;
  int in_EDI;
  CServerEntry *pEntry;
  CServerBrowser *pSelf;
  long local_20;
  
  if (in_RSI != 0) {
    for (local_20 = *(long *)(in_RSI + 0xce38); local_20 != 0;
        local_20 = *(long *)(local_20 + 0x22c8)) {
      if (*(int *)(local_20 + 0x28) == in_EDI) {
        iVar1 = time_get();
        *(int64 *)(local_20 + 0x18) = iVar1;
        return;
      }
    }
  }
  return;
}

Assistant:

void CServerBrowser::CBFTrackPacket(int TrackID, void *pCallbackUser)
{
	if(!pCallbackUser)
		return;

	CServerBrowser *pSelf = (CServerBrowser *)pCallbackUser;
	CServerEntry *pEntry = pSelf->m_pFirstReqServer;
	while(1)
	{
		if(!pEntry)	// no more entries
			break;

		if(pEntry->m_TrackID == TrackID)	// got it -> update
		{
			pEntry->m_RequestTime = time_get();
			break;
		}

		pEntry = pEntry->m_pNextReq;
	}
}